

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-to-source.cpp
# Opt level: O0

void get_nesting_structure(string *source)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long *plVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  undefined8 in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar8;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> nesting;
  uint idx;
  uint cur_line;
  char ch;
  ifstream ifs;
  value_type *in_stack_fffffffffffffd68;
  uint in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  undefined4 in_stack_fffffffffffffd78;
  uint in_stack_fffffffffffffd7c;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_> in_stack_fffffffffffffd80;
  uint local_218;
  char local_211;
  char local_210 [528];
  
  std::ifstream::ifstream(local_210,in_RDI,8);
  uVar3 = std::ifstream::is_open();
  if (((uVar3 & 1) != 0) && (uVar3 = std::ios::bad(), (uVar3 & 1) == 0)) {
    local_218 = 1;
    std::stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
    stack<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>
              ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    while( true ) {
      plVar4 = (long *)std::istream::get(local_210);
      bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
      if (!bVar1) break;
      iVar2 = (int)local_211;
      if (iVar2 == 10) {
        local_218 = local_218 + 1;
        bVar1 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
                empty((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                       *)0x10eee0);
        if (!bVar1) {
          std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::top
                    ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)0x10eeee);
          pVar8 = std::
                  map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                  ::emplace<unsigned_int&,unsigned_int&>
                            ((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                              *)in_stack_fffffffffffffd80._M_node,
                             (uint *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                             (uint *)CONCAT44(iVar2,in_stack_fffffffffffffd70));
          in_stack_fffffffffffffd80 = pVar8.first._M_node;
        }
      }
      else if (iVar2 == 0x7b) {
        sVar5 = std::
                vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ::size(&matching_braces);
        in_stack_fffffffffffffd7c = (uint)sVar5;
        std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
                  ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   CONCAT44(iVar2,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68);
        in_stack_fffffffffffffd78 = 0;
        std::
        vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::emplace_back<unsigned_int&,int>
                  ((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    *)in_stack_fffffffffffffd80._M_node,
                   (uint *)((ulong)in_stack_fffffffffffffd7c << 0x20),
                   (int *)CONCAT44(iVar2,in_stack_fffffffffffffd70));
      }
      else if (iVar2 == 0x7d) {
        pvVar6 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::top((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)0x10ef5f);
        in_stack_fffffffffffffd70 = local_218;
        pvVar7 = std::
                 vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ::operator[](&matching_braces,(ulong)*pvVar6);
        pvVar7->second = in_stack_fffffffffffffd70;
        std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::pop
                  ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   0x10ef93);
      }
    }
    std::ifstream::close();
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::~stack
              ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               0x10efb3);
    std::ifstream::~ifstream(local_210);
    return;
  }
  llvm::errs();
  llvm::raw_ostream::operator<<
            ((raw_ostream *)in_stack_fffffffffffffd80._M_node,
             (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  llvm::raw_ostream::operator<<
            ((raw_ostream *)in_stack_fffffffffffffd80._M_node,
             (string *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  llvm::raw_ostream::operator<<
            ((raw_ostream *)in_stack_fffffffffffffd80._M_node,
             (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  abort();
}

Assistant:

static void get_nesting_structure(const std::string &source) {
    std::ifstream ifs(source);
    if (!ifs.is_open() || ifs.bad()) {
        llvm::errs() << "Failed opening given source file: " << source << "\n";
        abort();
    }

    char ch;
    unsigned cur_line = 1;
    unsigned idx;
    std::stack<unsigned> nesting;
    while (ifs.get(ch)) {
        switch (ch) {
        case '\n':
            ++cur_line;
            if (!nesting.empty())
                nesting_structure.emplace(cur_line, nesting.top());
            break;
        case '{':
            nesting.push(matching_braces.size());
            matching_braces.emplace_back(cur_line, 0);
            break;
        case '}':
            idx = nesting.top();
            assert(idx < matching_braces.size());
            assert(matching_braces[idx].second == 0);
            matching_braces[idx].second = cur_line;
            nesting.pop();
            break;
        default:
            break;
        }
    }

    ifs.close();
}